

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TableModuleField::~TableModuleField(TableModuleField *this)

{
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TableModuleField_013e1778;
  std::__cxx11::string::~string((string *)&this->table);
  return;
}

Assistant:

explicit TableModuleField(const Location& loc = Location(),
                            string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Table>(loc), table(name) {}